

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HistogramBasedDistribution.cpp
# Opt level: O0

ostream * operator<<(ostream *os,HistogramBasedDistribution *distribution)

{
  int iVar1;
  bool bVar2;
  pointer ppVar3;
  ostream *poVar4;
  void *pvVar5;
  long in_RSI;
  ostream *in_RDI;
  int length_1;
  int length;
  double p;
  int start;
  const_iterator cit;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
  *in_stack_ffffffffffffffa8;
  ostream *in_stack_ffffffffffffffb0;
  double local_28;
  int local_1c;
  __normal_iterator<const_std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  local_18;
  long local_10;
  ostream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_18._M_current =
       (pair<int,_double> *)
       std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::begin
                 (in_stack_ffffffffffffffa8);
  local_1c = -1;
  local_28 = -1.0;
  do {
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::begin
              (in_stack_ffffffffffffffa8);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                        *)in_stack_ffffffffffffffb0,
                       (__normal_iterator<const_std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                        *)in_stack_ffffffffffffffa8);
    if (bVar2) {
      ppVar3 = __gnu_cxx::
               __normal_iterator<const_std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
               ::operator->(&local_18);
      iVar1 = ppVar3->first;
      poVar4 = (ostream *)std::ostream::operator<<(local_8,local_1c);
      in_stack_ffffffffffffffb0 = std::operator<<(poVar4,' ');
      ppVar3 = __gnu_cxx::
               __normal_iterator<const_std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
               ::operator->(&local_18);
      poVar4 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffffb0,ppVar3->first + -1);
      poVar4 = std::operator<<(poVar4,' ');
      pvVar5 = (void *)std::ostream::operator<<(poVar4,local_28 * (double)(iVar1 - local_1c));
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    }
    ppVar3 = __gnu_cxx::
             __normal_iterator<const_std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
             ::operator->(&local_18);
    local_1c = ppVar3->first;
    ppVar3 = __gnu_cxx::
             __normal_iterator<const_std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
             ::operator->(&local_18);
    local_28 = ppVar3->second;
    __gnu_cxx::
    __normal_iterator<const_std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
    ::operator++(&local_18);
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::end
              (in_stack_ffffffffffffffa8);
    bVar2 = __gnu_cxx::operator==
                      ((__normal_iterator<const_std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                        *)in_stack_ffffffffffffffb0,
                       (__normal_iterator<const_std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                        *)in_stack_ffffffffffffffa8);
  } while (!bVar2);
  iVar1 = *(int *)(local_10 + 0xc);
  poVar4 = (ostream *)std::ostream::operator<<(local_8,local_1c);
  poVar4 = std::operator<<(poVar4,' ');
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(int *)(local_10 + 0xc));
  poVar4 = std::operator<<(poVar4,' ');
  pvVar5 = (void *)std::ostream::operator<<(poVar4,local_28 * (double)((iVar1 - local_1c) + 1));
  std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  return local_8;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const HistogramBasedDistribution& distribution) {
	vector<HistogramBasedDistribution::value_t>::const_iterator cit = distribution.values.begin();
	int start = -1;
	double p = -1.0;
	while (true) {
		if (cit != distribution.values.begin()) {
			int length = cit->first - start;
			os << start << ' ' << (cit->first-1) << ' ' << (p*length) << endl;
		}
		start = cit->first;
		p = cit->second;
		++cit;
		if (cit == distribution.values.end()) {
			int length = distribution.max - start + 1;
			os << start << ' ' << distribution.max << ' ' << (p*length) << endl;
			break;
		}
	}
	return os;
}